

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::handleUnderOverlay(QPDFJob *this,QPDF *pdf)

{
  size_t *psVar1;
  pointer *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  Rectangle rect;
  undefined8 uVar2;
  size_t sVar3;
  bool bVar4;
  element_type *peVar5;
  mapped_type *pmVar6;
  reference dest_page_00;
  reference pUVar7;
  reference pvVar8;
  QPDFObjectHandle local_488;
  allocator<char> local_471;
  string local_470;
  string local_450;
  reference local_430;
  UnderOverlay *overlay;
  iterator __end2_1;
  iterator __begin2_1;
  vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_> *__range2_1;
  Rectangle local_400;
  allocator<char> local_3d9;
  string local_3d8;
  QPDFObjectHandle local_3b8;
  string local_3a8;
  string local_388;
  reference local_368;
  UnderOverlay *underlay;
  iterator __end2;
  iterator __begin2;
  vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_> *__range2;
  string content;
  size_t uo_idx;
  QPDFObjectHandle local_318 [2];
  allocator<char> local_2f1;
  string local_2f0 [32];
  string local_2d0;
  QPDFObjectHandle local_2b0;
  allocator<char> local_299;
  QPDFObjectHandle local_298 [2];
  undefined1 local_278 [8];
  QPDFObjectHandle resources;
  QPDFObjectHandle local_258;
  shared_ptr<Buffer> local_240;
  undefined1 local_230 [8];
  shared_ptr<Buffer> content_data;
  QPDFObjectHandle this_page_fo;
  QPDFObjectHandle dest_page_oh;
  value_type *dest_page;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1f0;
  undefined1 local_1cc [8];
  int pageno;
  size_t page_idx;
  size_t main_npages;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> main_pages;
  QPDFPageDocumentHelper main_pdh;
  map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
  overlay_fo;
  map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
  underlay_fo;
  vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
  opages;
  vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
  upages;
  undefined1 local_e8 [6];
  anon_class_1_0_00000001 get_pages;
  undefined1 local_b8 [8];
  map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
  overlay_pagenos;
  map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
  underlay_pagenos;
  UnderOverlay *uo_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_> *__range1_1;
  UnderOverlay *uo;
  iterator __end1;
  iterator __begin1;
  vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_> *__range1;
  QPDF *pdf_local;
  QPDFJob *this_local;
  
  peVar5 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  bVar4 = std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>::empty
                    (&peVar5->underlay);
  if (bVar4) {
    peVar5 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    bVar4 = std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>::empty
                      (&peVar5->overlay);
    if (bVar4) {
      return;
    }
  }
  peVar5 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  __end1 = std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>::begin
                     (&peVar5->underlay);
  uo = (UnderOverlay *)
       std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>::end
                 (&peVar5->underlay);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<QPDFJob::UnderOverlay_*,_std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>_>
                                     *)&uo), bVar4) {
    pUVar7 = __gnu_cxx::
             __normal_iterator<QPDFJob::UnderOverlay_*,_std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>_>
             ::operator*(&__end1);
    validateUnderOverlay(this,pdf,pUVar7);
    __gnu_cxx::
    __normal_iterator<QPDFJob::UnderOverlay_*,_std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>_>
    ::operator++(&__end1);
  }
  peVar5 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  __end1_1 = std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>::begin
                       (&peVar5->overlay);
  uo_1 = (UnderOverlay *)
         std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>::end
                   (&peVar5->overlay);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<QPDFJob::UnderOverlay_*,_std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>_>
                             *)&uo_1), bVar4) {
    pUVar7 = __gnu_cxx::
             __normal_iterator<QPDFJob::UnderOverlay_*,_std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>_>
             ::operator*(&__end1_1);
    validateUnderOverlay(this,pdf,pUVar7);
    __gnu_cxx::
    __normal_iterator<QPDFJob::UnderOverlay_*,_std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>_>
    ::operator++(&__end1_1);
  }
  psVar1 = &overlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
  ::map((map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
         *)psVar1);
  std::
  map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
  ::map((map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
         *)local_b8);
  peVar5 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  getUOPagenos(this,&peVar5->underlay,
               (map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                *)psVar1);
  peVar5 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  getUOPagenos(this,&peVar5->overlay,
               (map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                *)local_b8);
  std::function<void(Pipeline&,std::__cxx11::string_const&)>::
  function<QPDFJob::handleUnderOverlay(QPDF&)::__0,void>
            ((function<void(Pipeline&,std::__cxx11::string_const&)> *)local_e8,
             (anon_class_1_0_00000001 *)
             ((long)&upages.
                     super__Vector_base<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  doIfVerbose(this,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)local_e8);
  std::
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)local_e8);
  this_00 = &opages.
             super__Vector_base<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
  ::vector((vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
            *)this_00);
  peVar5 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  handleUnderOverlay::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             ((long)&upages.
                     super__Vector_base<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6),&peVar5->underlay,
             (vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
              *)this_00);
  psVar1 = &underlay_fo._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
  ::vector((vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
            *)psVar1);
  peVar5 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  handleUnderOverlay::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             ((long)&upages.
                     super__Vector_base<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6),&peVar5->overlay,
             (vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
              *)psVar1);
  std::
  map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
  ::map((map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
         *)&overlay_fo._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
  ::map((map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
         *)&main_pdh.m.
            super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper
            ((QPDFPageDocumentHelper *)
             &main_pages.
              super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,pdf);
  QPDFPageDocumentHelper::getAllPages
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&main_npages,
             (QPDFPageDocumentHelper *)
             &main_pages.
              super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  page_idx = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::size
                       ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                        &main_npages);
  stack0xfffffffffffffe38 = 0;
  do {
    if (page_idx <= stack0xfffffffffffffe38) {
      std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
                ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&main_npages
                );
      QPDFPageDocumentHelper::~QPDFPageDocumentHelper
                ((QPDFPageDocumentHelper *)
                 &main_pages.
                  super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
      ::~map((map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
              *)&main_pdh.m.
                 super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount);
      std::
      map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
      ::~map((map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
              *)&overlay_fo._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
      ::~vector((vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
                 *)&underlay_fo._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
      ::~vector((vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
                 *)&opages.
                    super__Vector_base<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
      ::~map((map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
              *)local_b8);
      std::
      map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
      ::~map((map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
              *)&overlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return;
    }
    local_1cc._0_4_ = QIntC::to_int<unsigned_long>((unsigned_long *)(local_1cc + 4));
    local_1cc._0_4_ = local_1cc._0_4_ + 1;
    dest_page = (value_type *)local_1cc;
    std::function<void(Pipeline&,std::__cxx11::string_const&)>::
    function<QPDFJob::handleUnderOverlay(QPDF&)::__1,void>
              ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_1f0,
               (anon_class_8_1_65c9f9ce *)&dest_page);
    doIfVerbose(this,&local_1f0);
    std::
    function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_1f0);
    pmVar6 = std::
             map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
             ::operator[]((map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                           *)&overlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (key_type *)local_1cc);
    bVar4 = std::
            map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::empty(pmVar6);
    if (bVar4) {
      pmVar6 = std::
               map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
               ::operator[]((map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                             *)local_b8,(key_type *)local_1cc);
      bVar4 = std::
              map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::empty(pmVar6);
      if (!bVar4) goto LAB_001ebf65;
    }
    else {
LAB_001ebf65:
      dest_page_00 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::at
                               ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                                 *)&main_npages,stack0xfffffffffffffe38);
      QPDFObjectHelper::getObjectHandle
                ((QPDFObjectHelper *)
                 &this_page_fo.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFPageObjectHelper::getFormXObjectForPage
                ((QPDFPageObjectHelper *)
                 &content_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 SUB81(dest_page_00,0));
      QPDFObjectHandle::getRawStreamData((QPDFObjectHandle *)local_230);
      std::shared_ptr<Buffer>::shared_ptr(&local_240,(shared_ptr<Buffer> *)local_230);
      local_258.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_258.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      QPDFObjectHandle::QPDFObjectHandle(&local_258);
      resources.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_01 = &resources.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this_01);
      QPDFObjectHandle::replaceStreamData
                ((QPDFObjectHandle *)
                 &content_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &local_240,&local_258,(QPDFObjectHandle *)this_01);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &resources.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFObjectHandle::~QPDFObjectHandle(&local_258);
      std::shared_ptr<Buffer>::~shared_ptr(&local_240);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_298,"/Resources",&local_299);
      operator____qpdf((char *)&local_2b0,0x41910b);
      QPDFObjectHandle::replaceKeyAndGetNew
                ((QPDFObjectHandle *)local_278,
                 (string *)
                 &this_page_fo.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,local_298);
      QPDFObjectHandle::~QPDFObjectHandle(&local_2b0);
      std::__cxx11::string::~string((string *)local_298);
      std::allocator<char>::~allocator(&local_299);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2f0,"/XObject",&local_2f1);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_2d0,(string *)local_278);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_318,"/Fx0",(allocator<char> *)((long)&uo_idx + 7));
      QPDFObjectHandle::replaceKeyAndGetNew
                ((QPDFObjectHandle *)&local_2d0.field_2,&local_2d0,local_318);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_2d0.field_2);
      std::__cxx11::string::~string((string *)local_318);
      std::allocator<char>::~allocator((allocator<char> *)((long)&uo_idx + 7));
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_2d0);
      std::__cxx11::string::~string(local_2f0);
      std::allocator<char>::~allocator(&local_2f1);
      content.field_2._8_8_ = 0;
      std::__cxx11::string::string((string *)&__range2);
      peVar5 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      __end2 = std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>::begin
                         (&peVar5->underlay);
      underlay = (UnderOverlay *)
                 std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>::end
                           (&peVar5->underlay);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<QPDFJob::UnderOverlay_*,_std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>_>
                                         *)&underlay), bVar4) {
        pUVar7 = __gnu_cxx::
                 __normal_iterator<QPDFJob::UnderOverlay_*,_std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>_>
                 ::operator*(&__end2);
        sVar3 = stack0xfffffffffffffe38;
        uVar2 = content.field_2._8_8_;
        local_368 = pUVar7;
        pvVar8 = std::
                 vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
                 ::operator[]((vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
                               *)&opages.
                                  super__Vector_base<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              content.field_2._8_8_);
        doUnderOverlayForPage_abi_cxx11_
                  (&local_388,this,pdf,pUVar7,
                   (map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                    *)&overlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_node_count,sVar3,uVar2,
                   (map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
                    *)&overlay_fo._M_t._M_impl.super__Rb_tree_header._M_node_count,pvVar8,
                   dest_page_00);
        std::__cxx11::string::operator+=((string *)&__range2,(string *)&local_388);
        std::__cxx11::string::~string((string *)&local_388);
        content.field_2._8_8_ = content.field_2._8_8_ + 1;
        __gnu_cxx::
        __normal_iterator<QPDFJob::UnderOverlay_*,_std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>_>
        ::operator++(&__end2);
      }
      QPDFObjectHandle::QPDFObjectHandle
                (&local_3b8,
                 (QPDFObjectHandle *)
                 &content_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"/Fx0",&local_3d9);
      QPDFPageObjectHelper::getMediaBox((QPDFPageObjectHelper *)&__range2_1,SUB81(dest_page_00,0));
      QPDFObjectHandle::getArrayAsRectangle(&local_400,(QPDFObjectHandle *)&__range2_1);
      rect.lly = local_400.lly;
      rect.llx = local_400.llx;
      rect.urx = local_400.urx;
      rect.ury = local_400.ury;
      QPDFPageObjectHelper::placeFormXObject
                (&local_3a8,dest_page_00,&local_3b8,&local_3d8,rect,true,false,false);
      std::__cxx11::string::operator+=((string *)&__range2,(string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_3a8);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range2_1);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::allocator<char>::~allocator(&local_3d9);
      QPDFObjectHandle::~QPDFObjectHandle(&local_3b8);
      content.field_2._8_8_ = 0;
      peVar5 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      __end2_1 = std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>::begin
                           (&peVar5->overlay);
      overlay = (UnderOverlay *)
                std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>::end
                          (&peVar5->overlay);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<QPDFJob::UnderOverlay_*,_std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>_>
                                 *)&overlay), bVar4) {
        pUVar7 = __gnu_cxx::
                 __normal_iterator<QPDFJob::UnderOverlay_*,_std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>_>
                 ::operator*(&__end2_1);
        sVar3 = stack0xfffffffffffffe38;
        uVar2 = content.field_2._8_8_;
        local_430 = pUVar7;
        pvVar8 = std::
                 vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
                 ::operator[]((vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
                               *)&underlay_fo._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              content.field_2._8_8_);
        doUnderOverlayForPage_abi_cxx11_
                  (&local_450,this,pdf,pUVar7,
                   (map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                    *)local_b8,sVar3,uVar2,
                   (map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
                    *)&main_pdh.m.
                       super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount,pvVar8,dest_page_00);
        std::__cxx11::string::operator+=((string *)&__range2,(string *)&local_450);
        std::__cxx11::string::~string((string *)&local_450);
        content.field_2._8_8_ = content.field_2._8_8_ + 1;
        __gnu_cxx::
        __normal_iterator<QPDFJob::UnderOverlay_*,_std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>_>
        ::operator++(&__end2_1);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,"/Contents",&local_471);
      QPDF::newStream((QPDF *)&local_488,(string *)pdf);
      QPDFObjectHandle::replaceKey
                ((QPDFObjectHandle *)
                 &this_page_fo.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,&local_470,
                 &local_488);
      QPDFObjectHandle::~QPDFObjectHandle(&local_488);
      std::__cxx11::string::~string((string *)&local_470);
      std::allocator<char>::~allocator(&local_471);
      std::__cxx11::string::~string((string *)&__range2);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_278);
      std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_230);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &content_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &this_page_fo.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    register0x00000000 = stack0xfffffffffffffe38 + 1;
  } while( true );
}

Assistant:

void
QPDFJob::handleUnderOverlay(QPDF& pdf)
{
    if (m->underlay.empty() && m->overlay.empty()) {
        return;
    }
    for (auto& uo: m->underlay) {
        validateUnderOverlay(pdf, &uo);
    }
    for (auto& uo: m->overlay) {
        validateUnderOverlay(pdf, &uo);
    }

    // First map key is 1-based page number. Second is index into the overlay/underlay vector. Watch
    // out to not reverse the keys or be off by one.
    std::map<int, std::map<size_t, std::vector<int>>> underlay_pagenos;
    std::map<int, std::map<size_t, std::vector<int>>> overlay_pagenos;
    getUOPagenos(m->underlay, underlay_pagenos);
    getUOPagenos(m->overlay, overlay_pagenos);
    doIfVerbose([&](Pipeline& v, std::string const& prefix) {
        v << prefix << ": processing underlay/overlay\n";
    });

    auto get_pages = [](std::vector<UnderOverlay>& v,
                        std::vector<std::vector<QPDFPageObjectHelper>>& v_out) {
        for (auto const& uo: v) {
            if (uo.pdf) {
                v_out.push_back(QPDFPageDocumentHelper(*(uo.pdf)).getAllPages());
            }
        }
    };
    std::vector<std::vector<QPDFPageObjectHelper>> upages;
    get_pages(m->underlay, upages);
    std::vector<std::vector<QPDFPageObjectHelper>> opages;
    get_pages(m->overlay, opages);

    std::map<int, std::map<size_t, QPDFObjectHandle>> underlay_fo;
    std::map<int, std::map<size_t, QPDFObjectHandle>> overlay_fo;
    QPDFPageDocumentHelper main_pdh(pdf);
    auto main_pages = main_pdh.getAllPages();
    size_t main_npages = main_pages.size();
    for (size_t page_idx = 0; page_idx < main_npages; ++page_idx) {
        auto pageno = QIntC::to_int(page_idx) + 1;
        doIfVerbose(
            [&](Pipeline& v, std::string const& prefix) { v << "  page " << pageno << "\n"; });
        if (underlay_pagenos[pageno].empty() && overlay_pagenos[pageno].empty()) {
            continue;
        }
        // This code converts the original page, any underlays, and any overlays to form XObjects.
        // Then it concatenates display of all underlays, the original page, and all overlays. Prior
        // to 11.3.0, the original page contents were wrapped in q/Q, but this didn't work if the
        // original page had unbalanced q/Q operators. See GitHub issue #904.
        auto& dest_page = main_pages.at(page_idx);
        auto dest_page_oh = dest_page.getObjectHandle();
        auto this_page_fo = dest_page.getFormXObjectForPage();
        // The resulting form xobject lazily reads the content from the original page, which we are
        // going to replace. Therefore, we have to explicitly copy it.
        auto content_data = this_page_fo.getRawStreamData();
        this_page_fo.replaceStreamData(content_data, QPDFObjectHandle(), QPDFObjectHandle());
        auto resources =
            dest_page_oh.replaceKeyAndGetNew("/Resources", "<< /XObject << >> >>"_qpdf);
        resources.getKey("/XObject").replaceKeyAndGetNew("/Fx0", this_page_fo);
        size_t uo_idx{0};
        std::string content;
        for (auto& underlay: m->underlay) {
            content += doUnderOverlayForPage(
                pdf,
                underlay,
                underlay_pagenos,
                page_idx,
                uo_idx,
                underlay_fo,
                upages[uo_idx],
                dest_page);
            ++uo_idx;
        }
        content += dest_page.placeFormXObject(
            this_page_fo,
            "/Fx0",
            dest_page.getMediaBox().getArrayAsRectangle(),
            true,
            false,
            false);
        uo_idx = 0;
        for (auto& overlay: m->overlay) {
            content += doUnderOverlayForPage(
                pdf,
                overlay,
                overlay_pagenos,
                page_idx,
                uo_idx,
                overlay_fo,
                opages[uo_idx],
                dest_page);
            ++uo_idx;
        }
        dest_page_oh.replaceKey("/Contents", pdf.newStream(content));
    }
}